

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdatePlatformWindows(void)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  ImGuiViewportFlags *pIVar3;
  ImVector<ImGuiViewportP_*> *this;
  _func_void_ImGuiViewport_ptr_ImVec2 *p_Var4;
  ImVec2 IVar5;
  char *text;
  _func_void_ImGuiViewport_ptr_float *p_Var6;
  _func_void_ImGuiViewport_ptr *p_Var7;
  ImGuiContext *pIVar8;
  bool bVar9;
  ImU32 IVar10;
  int iVar11;
  ImGuiViewportP **ppIVar12;
  ImGuiWindow *pIVar13;
  char *pcVar14;
  int i;
  int iVar15;
  char cVar16;
  ImGuiViewportP *pIVar17;
  float fVar18;
  
  pIVar8 = GImGui;
  iVar15 = GImGui->FrameCountEnded;
  if (iVar15 != GImGui->FrameCount) {
    __assert_fail("g.FrameCountEnded == g.FrameCount && \"Forgot to call Render() or EndFrame() before UpdatePlatformWindows()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2cf9,"void ImGui::UpdatePlatformWindows()");
  }
  if (iVar15 <= GImGui->FrameCountPlatformEnded) {
    __assert_fail("g.FrameCountPlatformEnded < g.FrameCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2cfa,"void ImGui::UpdatePlatformWindows()");
  }
  GImGui->FrameCountPlatformEnded = iVar15;
  if ((pIVar8->ConfigFlagsCurrFrame & 0x400) != 0) {
    this = &pIVar8->Viewports;
    iVar15 = 1;
    while( true ) {
      cVar16 = '\x01';
      iVar11 = this->Size;
      if (iVar11 <= iVar15) break;
      ppIVar12 = ImVector<ImGuiViewportP_*>::operator[](this,iVar15);
      pIVar17 = *ppIVar12;
      pIVar13 = pIVar17->Window;
      if (pIVar13 == (ImGuiWindow *)0x0) {
        cVar16 = '\0';
      }
      else if (pIVar13->Active == true) {
        cVar16 = pIVar13->Hidden;
      }
      if (pIVar17->LastFrameActive < pIVar8->FrameCount + -1 || cVar16 != '\0') {
        DestroyPlatformWindow(pIVar17);
      }
      else if (((pIVar8->FrameCount <= pIVar17->LastFrameActive) &&
               (0.0 < (pIVar17->super_ImGuiViewport).Size.x)) &&
              (0.0 < (pIVar17->super_ImGuiViewport).Size.y)) {
        bVar9 = pIVar17->PlatformWindowCreated;
        if (bVar9 == false) {
          (*(pIVar8->PlatformIO).Platform_CreateWindow)(&pIVar17->super_ImGuiViewport);
          p_Var7 = (pIVar8->PlatformIO).Renderer_CreateWindow;
          if (p_Var7 != (_func_void_ImGuiViewport_ptr *)0x0) {
            (*p_Var7)(&pIVar17->super_ImGuiViewport);
          }
          pIVar17->LastNameHash = 0;
          (pIVar17->LastPlatformPos).x = 3.4028235e+38;
          (pIVar17->LastPlatformPos).y = 3.4028235e+38;
          (pIVar17->LastPlatformSize).x = 3.4028235e+38;
          (pIVar17->LastPlatformSize).y = 3.4028235e+38;
          pIVar17->LastRendererSize = (pIVar17->super_ImGuiViewport).Size;
          pIVar17->PlatformWindowCreated = true;
          fVar18 = 3.4028235e+38;
        }
        else {
          fVar18 = (pIVar17->LastPlatformPos).x;
        }
        pIVar1 = &(pIVar17->super_ImGuiViewport).Pos;
        if ((fVar18 != pIVar1->x) || (NAN(fVar18) || NAN(pIVar1->x))) {
LAB_00130fdc:
          if ((pIVar17->super_ImGuiViewport).PlatformRequestMove == false) {
            (*(pIVar8->PlatformIO).Platform_SetWindowPos)
                      (&pIVar17->super_ImGuiViewport,(pIVar17->super_ImGuiViewport).Pos);
          }
        }
        else {
          fVar18 = (pIVar17->LastPlatformPos).y;
          pfVar2 = &(pIVar17->super_ImGuiViewport).Pos.y;
          if ((fVar18 != *pfVar2) || (NAN(fVar18) || NAN(*pfVar2))) goto LAB_00130fdc;
        }
        fVar18 = (pIVar17->LastPlatformSize).x;
        pIVar1 = &(pIVar17->super_ImGuiViewport).Size;
        if ((fVar18 != pIVar1->x) || (NAN(fVar18) || NAN(pIVar1->x))) {
LAB_00131017:
          if ((pIVar17->super_ImGuiViewport).PlatformRequestResize == false) {
            (*(pIVar8->PlatformIO).Platform_SetWindowSize)
                      (&pIVar17->super_ImGuiViewport,(pIVar17->super_ImGuiViewport).Size);
          }
        }
        else {
          fVar18 = (pIVar17->LastPlatformSize).y;
          pfVar2 = &(pIVar17->super_ImGuiViewport).Size.y;
          if ((fVar18 != *pfVar2) || (NAN(fVar18) || NAN(*pfVar2))) goto LAB_00131017;
        }
        fVar18 = (pIVar17->LastRendererSize).x;
        pIVar1 = &(pIVar17->super_ImGuiViewport).Size;
        if ((fVar18 != pIVar1->x) || (NAN(fVar18) || NAN(pIVar1->x))) {
LAB_00131052:
          p_Var4 = (pIVar8->PlatformIO).Renderer_SetWindowSize;
          if (p_Var4 != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
            (*p_Var4)(&pIVar17->super_ImGuiViewport,(pIVar17->super_ImGuiViewport).Size);
          }
        }
        else {
          fVar18 = (pIVar17->LastRendererSize).y;
          pfVar2 = &(pIVar17->super_ImGuiViewport).Size.y;
          if ((fVar18 != *pfVar2) || (NAN(fVar18) || NAN(*pfVar2))) goto LAB_00131052;
        }
        IVar5 = (pIVar17->super_ImGuiViewport).Size;
        pIVar17->LastPlatformPos = (pIVar17->super_ImGuiViewport).Pos;
        pIVar17->LastRendererSize = IVar5;
        pIVar17->LastPlatformSize = IVar5;
        pIVar13 = pIVar17->Window;
        if ((pIVar13->DockNodeAsHost == (ImGuiDockNode *)0x0) ||
           (pIVar13 = pIVar13->DockNodeAsHost->VisibleWindow, pIVar13 != (ImGuiWindow *)0x0)) {
          text = pIVar13->Name;
          pcVar14 = FindRenderedTextEnd(text,(char *)0x0);
          IVar10 = ImHashStr(text,(long)pcVar14 - (long)text,0);
          if (pIVar17->LastNameHash != IVar10) {
            cVar16 = *pcVar14;
            *pcVar14 = '\0';
            (*(pIVar8->PlatformIO).Platform_SetWindowTitle)(&pIVar17->super_ImGuiViewport,text);
            *pcVar14 = cVar16;
            pIVar17->LastNameHash = IVar10;
          }
        }
        fVar18 = pIVar17->Alpha;
        if (((pIVar17->LastAlpha != fVar18) || (NAN(pIVar17->LastAlpha) || NAN(fVar18))) &&
           (p_Var6 = (pIVar8->PlatformIO).Platform_SetWindowAlpha,
           p_Var6 != (_func_void_ImGuiViewport_ptr_float *)0x0)) {
          (*p_Var6)(&pIVar17->super_ImGuiViewport,fVar18);
          fVar18 = pIVar17->Alpha;
        }
        pIVar17->LastAlpha = fVar18;
        p_Var7 = (pIVar8->PlatformIO).Platform_UpdateWindow;
        if (p_Var7 != (_func_void_ImGuiViewport_ptr *)0x0) {
          (*p_Var7)(&pIVar17->super_ImGuiViewport);
        }
        if (bVar9 == false) {
          if (pIVar8->FrameCount < 3) {
            pIVar3 = &(pIVar17->super_ImGuiViewport).Flags;
            *(byte *)pIVar3 = (byte)*pIVar3 | 4;
          }
          (*(pIVar8->PlatformIO).Platform_ShowWindow)(&pIVar17->super_ImGuiViewport);
          if (pIVar17->LastFrontMostStampCount != pIVar8->ViewportFrontMostStampCount) {
            iVar11 = pIVar8->ViewportFrontMostStampCount + 1;
            pIVar8->ViewportFrontMostStampCount = iVar11;
            pIVar17->LastFrontMostStampCount = iVar11;
          }
        }
        (pIVar17->super_ImGuiViewport).PlatformRequestMove = false;
        (pIVar17->super_ImGuiViewport).PlatformRequestResize = false;
        (pIVar17->super_ImGuiViewport).PlatformRequestClose = false;
      }
      iVar15 = iVar15 + 1;
    }
    if ((pIVar8->PlatformIO).Platform_GetWindowFocus != (_func_bool_ImGuiViewport_ptr *)0x0) {
      pIVar17 = (ImGuiViewportP *)0x0;
      for (iVar15 = 0; (pIVar17 == (ImGuiViewportP *)0x0 && (iVar15 < iVar11)); iVar15 = iVar15 + 1)
      {
        ppIVar12 = ImVector<ImGuiViewportP_*>::operator[](this,iVar15);
        pIVar17 = *ppIVar12;
        if (pIVar17->PlatformWindowCreated == true) {
          bVar9 = (*(pIVar8->PlatformIO).Platform_GetWindowFocus)(&pIVar17->super_ImGuiViewport);
          if (!bVar9) {
            pIVar17 = (ImGuiViewportP *)0x0;
          }
        }
        else {
          pIVar17 = (ImGuiViewportP *)0x0;
        }
        iVar11 = this->Size;
      }
      if ((pIVar17 != (ImGuiViewportP *)0x0) &&
         (pIVar17->LastFrontMostStampCount != pIVar8->ViewportFrontMostStampCount)) {
        iVar15 = pIVar8->ViewportFrontMostStampCount + 1;
        pIVar8->ViewportFrontMostStampCount = iVar15;
        pIVar17->LastFrontMostStampCount = iVar15;
      }
    }
  }
  return;
}

Assistant:

void ImGui::UpdatePlatformWindows()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.FrameCountEnded == g.FrameCount && "Forgot to call Render() or EndFrame() before UpdatePlatformWindows()?");
    IM_ASSERT(g.FrameCountPlatformEnded < g.FrameCount);
    g.FrameCountPlatformEnded = g.FrameCount;
    if (!(g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable))
        return;

    // Create/resize/destroy platform windows to match each active viewport.
    // Skip the main viewport (index 0), which is always fully handled by the application!
    for (int i = 1; i < g.Viewports.Size; i++)
    {
        ImGuiViewportP* viewport = g.Viewports[i];

        // Destroy platform window if the viewport hasn't been submitted or if it is hosting a hidden window
        // (the implicit/fallback Debug##Default window will be registering its viewport then be disabled, causing a dummy DestroyPlatformWindow to be made each frame)
        bool destroy_platform_window = false;
        destroy_platform_window |= (viewport->LastFrameActive < g.FrameCount - 1);
        destroy_platform_window |= (viewport->Window && !IsWindowActiveAndVisible(viewport->Window));
        if (destroy_platform_window)
        {
            DestroyPlatformWindow(viewport);
            continue;
        }

        // New windows that appears directly in a new viewport won't always have a size on their first frame
        if (viewport->LastFrameActive < g.FrameCount || viewport->Size.x <= 0 || viewport->Size.y <= 0)
            continue;

        // Create window
        bool is_new_platform_window = (viewport->PlatformWindowCreated == false);
        if (is_new_platform_window)
        {
            IMGUI_DEBUG_LOG_VIEWPORT("Create Platform Window %08X (%s)\n", viewport->ID, viewport->Window ? viewport->Window->Name : "n/a");
            g.PlatformIO.Platform_CreateWindow(viewport);
            if (g.PlatformIO.Renderer_CreateWindow != NULL)
                g.PlatformIO.Renderer_CreateWindow(viewport);
            viewport->LastNameHash = 0;
            viewport->LastPlatformPos = viewport->LastPlatformSize = ImVec2(FLT_MAX, FLT_MAX); // By clearing those we'll enforce a call to Platform_SetWindowPos/Size below, before Platform_ShowWindow (FIXME: Is that necessary?)
            viewport->LastRendererSize = viewport->Size;                                       // We don't need to call Renderer_SetWindowSize() as it is expected Renderer_CreateWindow() already did it.
            viewport->PlatformWindowCreated = true;
        }

        // Apply Position and Size (from ImGui to Platform/Renderer backends)
        if ((viewport->LastPlatformPos.x != viewport->Pos.x || viewport->LastPlatformPos.y != viewport->Pos.y) && !viewport->PlatformRequestMove)
            g.PlatformIO.Platform_SetWindowPos(viewport, viewport->Pos);
        if ((viewport->LastPlatformSize.x != viewport->Size.x || viewport->LastPlatformSize.y != viewport->Size.y) && !viewport->PlatformRequestResize)
            g.PlatformIO.Platform_SetWindowSize(viewport, viewport->Size);
        if ((viewport->LastRendererSize.x != viewport->Size.x || viewport->LastRendererSize.y != viewport->Size.y) && g.PlatformIO.Renderer_SetWindowSize)
            g.PlatformIO.Renderer_SetWindowSize(viewport, viewport->Size);
        viewport->LastPlatformPos = viewport->Pos;
        viewport->LastPlatformSize = viewport->LastRendererSize = viewport->Size;

        // Update title bar (if it changed)
        if (ImGuiWindow* window_for_title = GetWindowForTitleDisplay(viewport->Window))
        {
            const char* title_begin = window_for_title->Name;
            char* title_end = (char*)(intptr_t)FindRenderedTextEnd(title_begin);
            const ImGuiID title_hash = ImHashStr(title_begin, title_end - title_begin);
            if (viewport->LastNameHash != title_hash)
            {
                char title_end_backup_c = *title_end;
                *title_end = 0; // Cut existing buffer short instead of doing an alloc/free, no small gain.
                g.PlatformIO.Platform_SetWindowTitle(viewport, title_begin);
                *title_end = title_end_backup_c;
                viewport->LastNameHash = title_hash;
            }
        }

        // Update alpha (if it changed)
        if (viewport->LastAlpha != viewport->Alpha && g.PlatformIO.Platform_SetWindowAlpha)
            g.PlatformIO.Platform_SetWindowAlpha(viewport, viewport->Alpha);
        viewport->LastAlpha = viewport->Alpha;

        // Optional, general purpose call to allow the backend to perform general book-keeping even if things haven't changed.
        if (g.PlatformIO.Platform_UpdateWindow)
            g.PlatformIO.Platform_UpdateWindow(viewport);

        if (is_new_platform_window)
        {
            // On startup ensure new platform window don't steal focus (give it a few frames, as nested contents may lead to viewport being created a few frames late)
            if (g.FrameCount < 3)
                viewport->Flags |= ImGuiViewportFlags_NoFocusOnAppearing;

            // Show window
            g.PlatformIO.Platform_ShowWindow(viewport);

            // Even without focus, we assume the window becomes front-most.
            // This is useful for our platform z-order heuristic when io.MouseHoveredViewport is not available.
            if (viewport->LastFrontMostStampCount != g.ViewportFrontMostStampCount)
                viewport->LastFrontMostStampCount = ++g.ViewportFrontMostStampCount;
        }

        // Clear request flags
        viewport->ClearRequestFlags();
    }

    // Update our implicit z-order knowledge of platform windows, which is used when the backend cannot provide io.MouseHoveredViewport.
    // When setting Platform_GetWindowFocus, it is expected that the platform backend can handle calls without crashing if it doesn't have data stored.
    // FIXME-VIEWPORT: We should use this information to also set dear imgui-side focus, allowing us to handle os-level alt+tab.
    if (g.PlatformIO.Platform_GetWindowFocus != NULL)
    {
        ImGuiViewportP* focused_viewport = NULL;
        for (int n = 0; n < g.Viewports.Size && focused_viewport == NULL; n++)
        {
            ImGuiViewportP* viewport = g.Viewports[n];
            if (viewport->PlatformWindowCreated)
                if (g.PlatformIO.Platform_GetWindowFocus(viewport))
                    focused_viewport = viewport;
        }

        // Store a tag so we can infer z-order easily from all our windows
        if (focused_viewport && focused_viewport->LastFrontMostStampCount != g.ViewportFrontMostStampCount)
            focused_viewport->LastFrontMostStampCount = ++g.ViewportFrontMostStampCount;
    }
}